

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::addHangLimitSupport(TranslateToFuzzReader *this)

{
  char *pcVar1;
  Type type;
  Const *pCVar2;
  Name name;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> local_30;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> glob;
  
  pcVar1 = (char *)(this->HANG_LIMIT_GLOBAL).super_IString.str._M_len;
  type.id = (uintptr_t)(this->HANG_LIMIT_GLOBAL).super_IString.str._M_str;
  pCVar2 = Builder::makeConst<int>(&this->builder,(this->fuzzParams->super_FuzzParams).HANG_LIMIT);
  name.super_IString.str._M_str = pcVar1;
  name.super_IString.str._M_len = (size_t)&local_30;
  Builder::makeGlobal(name,type,(Expression *)0x2,(Mutability)pCVar2);
  wasm::Module::addGlobal((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitSupport() {
  auto glob =
    builder.makeGlobal(HANG_LIMIT_GLOBAL,
                       Type::i32,
                       builder.makeConst(int32_t(fuzzParams->HANG_LIMIT)),
                       Builder::Mutable);
  wasm.addGlobal(std::move(glob));
}